

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Unserialize<AutoFile,std::byte,std::allocator<std::byte>>
               (AutoFile *is,vector<std::byte,_std::allocator<std::byte>_> *v)

{
  long lVar1;
  Span<std::byte> s;
  uint uVar2;
  uint64_t uVar3;
  uint *puVar4;
  size_t in_RCX;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  uint blk;
  uint i;
  uint nSize;
  AutoFile *in_stack_00000038;
  AutoFile *in_stack_ffffffffffffffa8;
  Span<std::byte> in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  uint uVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,_std::allocator<std::byte>_>::clear
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffffa8);
  uVar3 = ReadCompactSize<AutoFile>(in_stack_00000038,is._7_1_);
  uVar2 = (uint)uVar3;
  for (uVar6 = 0; uVar6 < uVar2; uVar6 = uVar5 + uVar6) {
    puVar4 = std::min<unsigned_int>
                       ((uint *)in_stack_ffffffffffffffb0.m_data,(uint *)in_stack_ffffffffffffffa8);
    uVar5 = *puVar4;
    std::vector<std::byte,_std::allocator<std::byte>_>::resize
              ((vector<std::byte,_std::allocator<std::byte>_> *)CONCAT44(uVar2,uVar6),
               CONCAT44(uVar5,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffa8 = in_RDI;
    std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffffb0.m_size,
               (size_type)in_stack_ffffffffffffffb0.m_data);
    Span<std::byte>::Span<std::byte,_0>
              ((Span<std::byte> *)in_stack_ffffffffffffffb0.m_size,in_stack_ffffffffffffffb0.m_data,
               (size_t)in_stack_ffffffffffffffa8);
    s.m_data._4_4_ = uVar5;
    s.m_data._0_4_ = in_stack_ffffffffffffffc0;
    s.m_size._0_4_ = uVar6;
    s.m_size._4_4_ = uVar2;
    in_stack_ffffffffffffffb0 = AsWritableBytes<std::byte>(s);
    AutoFile::read(in_stack_ffffffffffffffa8,(int)in_stack_ffffffffffffffb0.m_data,
                   (void *)in_stack_ffffffffffffffb0.m_size,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}